

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDnaSequence.cpp
# Opt level: O3

char __thiscall NamedDnaSequence::decode(NamedDnaSequence *this,uchar c)

{
  char cVar1;
  
  cVar1 = 'N';
  if (c < 9) {
    cVar1 = "ACGTacgtn"[c];
  }
  return cVar1;
}

Assistant:

char NamedDnaSequence::decode(unsigned char c) const {
	switch (c) {
	case 0: return 'A';
	case 1: return 'C';
	case 2: return 'G';
	case 3: return 'T';
	case 4: return 'a';
	case 5: return 'c';
	case 6: return 'g';
	case 7: return 't';
	case 8: return 'n';
	default: return 'N';
	}
}